

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D_adaptive<vector_brodnik<unsigned_char*>>
               (uchar **strings,size_t n,size_t depth,vector_brodnik<unsigned_char_*> *buckets)

{
  long lVar1;
  uint16_t uVar2;
  long *__ptr;
  size_t sVar3;
  uchar **t;
  size_t j;
  long lVar4;
  uint i_2;
  ulong uVar5;
  vector_brodnik<unsigned_char_*> *pvVar6;
  uint i_1;
  uchar **t_00;
  long lVar7;
  uint16_t cache [16];
  
  if (n < 0x10000) {
    msd_D<vector_brodnik<unsigned_char*>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  t_00 = strings;
  for (uVar5 = 0; uVar5 < (n & 0xfffffffffffffff0); uVar5 = uVar5 + 0x10) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar2 = get_char<unsigned_short>(t_00[lVar4],depth);
      cache[lVar4] = uVar2;
    }
    t = t_00;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      vector_brodnik<unsigned_char_*>::push_back(buckets + cache[lVar4],t);
      t = t + 1;
    }
    t_00 = t_00 + 0x10;
  }
  for (; uVar5 < n; uVar5 = uVar5 + 1) {
    uVar2 = get_char<unsigned_short>(*t_00,depth);
    vector_brodnik<unsigned_char_*>::push_back(buckets + uVar2,t_00);
    t_00 = t_00 + 1;
  }
  pvVar6 = buckets;
  for (lVar4 = 0; lVar4 != 0x10000; lVar4 = lVar4 + 1) {
    sVar3 = vector_brodnik<unsigned_char_*>::size(pvVar6);
    __ptr[lVar4] = sVar3;
    pvVar6 = pvVar6 + 1;
  }
  lVar4 = 0;
  pvVar6 = buckets;
  for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
    lVar1 = __ptr[lVar7];
    if (lVar1 != 0) {
      copy<unsigned_char*,unsigned_char**>(pvVar6,strings + lVar4);
      lVar4 = lVar4 + lVar1;
    }
    pvVar6 = pvVar6 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x380000; lVar4 = lVar4 + 0x38) {
    vector_brodnik<unsigned_char_*>::clear
              ((vector_brodnik<unsigned_char_*> *)
               ((long)&(buckets->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
  }
  lVar4 = *__ptr;
  for (lVar7 = 1; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
    sVar3 = __ptr[lVar7];
    if (sVar3 != 0) {
      if ((char)lVar7 != '\0') {
        msd_D_adaptive<vector_brodnik<unsigned_char*>>(strings + lVar4,sVar3,depth + 2,buckets);
      }
      lVar4 = lVar4 + sVar3;
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}